

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O0

nvlist_t * nvlist_get_pararr(nvlist_t *nvl,void **cookiep)

{
  nvlist_t *ret;
  void **cookiep_local;
  nvlist_t *nvl_local;
  
  nvl_local = nvlist_get_array_next(nvl);
  if (nvl_local == (nvlist_t *)0x0) {
    nvl_local = nvlist_get_parent(nvl,cookiep);
  }
  else if (cookiep != (void **)0x0) {
    *cookiep = (void *)0x0;
  }
  return nvl_local;
}

Assistant:

const nvlist_t *
nvlist_get_pararr(const nvlist_t *nvl, void **cookiep)
{
	const nvlist_t *ret;

	ret = nvlist_get_array_next(nvl);
	if (ret != NULL) {
		if (cookiep != NULL)
			*cookiep = NULL;
		return (ret);
	}

	return (nvlist_get_parent(nvl, cookiep));
}